

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QSslConfiguration __thiscall QNetworkRequest::sslConfiguration(QNetworkRequest *this)

{
  QNetworkRequestPrivate *pQVar1;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  QSslConfiguration *in_stack_ffffffffffffffc8;
  QSslConfiguration *in_stack_ffffffffffffffd0;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QNetworkRequestPrivate> *)0x1f2b0e);
  if (pQVar1->sslConfiguration == (QSslConfiguration *)0x0) {
    in_stack_ffffffffffffffd0 = (QSslConfiguration *)operator_new(8);
    QSslConfiguration::defaultConfiguration();
    pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->
                       ((QSharedDataPointer<QNetworkRequestPrivate> *)0x1f2b36);
    pQVar1->sslConfiguration = in_stack_ffffffffffffffd0;
  }
  QSharedDataPointer<QNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QNetworkRequestPrivate> *)0x1f2b49);
  QSslConfiguration::QSslConfiguration(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
}

Assistant:

QSslConfiguration QNetworkRequest::sslConfiguration() const
{
    if (!d->sslConfiguration)
        d->sslConfiguration = new QSslConfiguration(QSslConfiguration::defaultConfiguration());
    return *d->sslConfiguration;
}